

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void touchvar(char *name)

{
  ident *this;
  ident *id;
  char *name_local;
  
  id = (ident *)name;
  this = hashset<ident>::access<char_const*>(&idents,(char **)&id);
  if ((this != (ident *)0x0) && ((uint)this->type < 3)) {
    ident::changed(this);
  }
  return;
}

Assistant:

void touchvar(const char *name)
{
    ident *id = idents.access(name);
    if(id) switch(id->type)
    {
        case ID_VAR:
        case ID_FVAR:
        case ID_SVAR:
            id->changed();
            break;
    }
}